

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O0

FileOptions * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::
BuildDynamicProto<google::protobuf::FileOptions>
          (FileOptions *__return_storage_ptr__,RetentionStripTest *this,string_view data)

{
  bool bVar1;
  Message *output;
  Descriptor *pDVar2;
  Message *pMVar3;
  pointer pMVar4;
  MessageLite *this_00;
  LogMessage *pLVar5;
  string_view sVar6;
  LogMessage local_1c0;
  Voidify local_1a9;
  string local_1a8;
  string_view local_188;
  undefined1 local_172;
  byte local_171;
  LogMessage local_170;
  Voidify local_159;
  RetentionStripTest *local_158;
  size_t sStack_150;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_148;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_message;
  DynamicMessageFactory factory;
  FileOptions local_f0;
  Message *local_40;
  char *local_38;
  Descriptor *local_30;
  Descriptor *file_options_descriptor;
  RetentionStripTest *this_local;
  string_view data_local;
  FileOptions *ret;
  
  data_local._M_len = (size_t)data._M_str;
  this_local = (RetentionStripTest *)data._M_len;
  file_options_descriptor = (Descriptor *)this;
  data_local._M_str = (char *)__return_storage_ptr__;
  FileOptions::FileOptions(&local_f0);
  sVar6 = protobuf::MessageLite::GetTypeName((MessageLite *)&local_f0);
  local_38 = sVar6._M_str;
  output = (Message *)sVar6._M_len;
  local_40 = output;
  pDVar2 = DescriptorPool::FindMessageTypeByName(&this->pool_,sVar6);
  FileOptions::~FileOptions(&local_f0);
  local_30 = pDVar2;
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
  pMVar3 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&dynamic_message,local_30);
  pMVar3 = Message::New(pMVar3);
  std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
  unique_ptr<std::default_delete<google::protobuf::Message>,void>
            ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>> *
             )&local_148,pMVar3);
  local_158 = this_local;
  sStack_150 = data_local._M_len;
  pMVar4 = std::
           unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
           get(&local_148);
  local_171 = 0;
  sVar6._M_str = (char *)pMVar4;
  sVar6._M_len = sStack_150;
  bVar1 = TextFormat::ParseFromString((TextFormat *)local_158,sVar6,output);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x5f,"TextFormat::ParseFromString(data, dynamic_message.get())");
    local_171 = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_170);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_159,pLVar5);
  }
  if ((local_171 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_170);
  }
  local_172 = 0;
  FileOptions::FileOptions(__return_storage_ptr__);
  this_00 = &std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::operator->(&local_148)->super_MessageLite;
  protobuf::MessageLite::SerializeAsString_abi_cxx11_(&local_1a8,this_00);
  local_188 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1a8);
  bVar1 = protobuf::MessageLite::ParseFromString((MessageLite *)__return_storage_ptr__,local_188);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
               ,0x61,"ret.ParseFromString(dynamic_message->SerializeAsString())");
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_1a9,pLVar5);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1c0);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  local_172 = 1;
  std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
  ~unique_ptr(&local_148);
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_message);
  return __return_storage_ptr__;
}

Assistant:

ProtoType BuildDynamicProto(absl::string_view data) {
    // We use a dynamic message to generate the expected options proto. This
    // lets us parse the custom options in text format.
    const Descriptor* file_options_descriptor =
        pool_.FindMessageTypeByName(ProtoType().GetTypeName());
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_message(
        factory.GetPrototype(file_options_descriptor)->New());
    ABSL_CHECK(TextFormat::ParseFromString(data, dynamic_message.get()));
    ProtoType ret;
    ABSL_CHECK(ret.ParseFromString(dynamic_message->SerializeAsString()));
    return ret;
  }